

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxUnaryNotBoolean::Emit(FxUnaryNotBoolean *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  uint opa;
  uint opb;
  uint opc;
  undefined4 extraout_var;
  bool local_31;
  ExpEmit local_28;
  ExpEmit from;
  VMFunctionBuilder *build_local;
  FxUnaryNotBoolean *this_local;
  ExpEmit to;
  
  from = (ExpEmit)build;
  if (this->Operand->ValueType != (PType *)TypeBool) {
    __assert_fail("Operand->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x781,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  local_31 = true;
  if ((this->super_FxExpression).ValueType != (PType *)TypeBool) {
    local_31 = FxExpression::IsInteger(&this->super_FxExpression);
  }
  if (local_31 == false) {
    __assert_fail("ValueType == TypeBool || IsInteger()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x782,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  local_28._0_4_ = (*this->Operand->_vptr_FxExpression[9])(this->Operand,from);
  local_28.Konst = (bool)(char)extraout_var;
  local_28.Fixed = (bool)(char)((uint)extraout_var >> 8);
  local_28.Final = (bool)(char)((uint)extraout_var >> 0x10);
  local_28.Target = (bool)(char)((uint)extraout_var >> 0x18);
  ExpEmit::Free(&local_28,(VMFunctionBuilder *)from);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)from,0,1);
  EVar1 = from;
  if (((local_28.Konst ^ 0xffU) & 1) == 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x786,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  opa = (uint)(ushort)this_local;
  opb = (uint)local_28.RegNum;
  opc = VMFunctionBuilder::GetConstantInt((VMFunctionBuilder *)from,1);
  VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar1,0x7c,opa,opb,opc);
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (ushort)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *build)
{
	assert(Operand->ValueType == TypeBool);
	assert(ValueType == TypeBool || IsInteger());	// this may have been changed by an int cast.
	ExpEmit from = Operand->Emit(build);
	from.Free(build);
	ExpEmit to(build, REGT_INT);
	assert(!from.Konst);
	// boolean not is the same as XOR-ing the lowest bit

	build->Emit(OP_XOR_RK, to.RegNum, from.RegNum, build->GetConstantInt(1));
	return to;
}